

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O2

int __thiscall deqp::egl::ChooseConfigTests::init(ChooseConfigTests *this,EVP_PKEY_CTX *ctx)

{
  EGLenum attribute;
  char *name;
  EglTestContext *pEVar1;
  undefined8 uVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  TestNode *node;
  TestNode *node_00;
  ChooseConfigSimpleCase *pCVar4;
  ChooseConfigRandomCase *pCVar5;
  ColorComponentTypeCase *pCVar6;
  uint (*arr) [2];
  uint (*arr_00) [2];
  long lVar7;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> set;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"simple",
             "Simple tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "selection_only","Selection tests, order ignored");
  tcu::TestNode::addChild(pTVar3,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "selection_and_sort","Selection and ordering tests");
  tcu::TestNode::addChild(pTVar3,node_00);
  for (lVar7 = 8; lVar7 != 0x1c8; lVar7 = lVar7 + 0x10) {
    pCVar4 = (ChooseConfigSimpleCase *)operator_new(0xa8);
    name = *(char **)((long)&init::attributes[0].attribute + lVar7);
    attribute = *(EGLenum *)(&UNK_01e0b7f8 + lVar7);
    ChooseConfigSimpleCase::ChooseConfigSimpleCase
              (pCVar4,(this->super_TestCaseGroup).m_eglTestCtx,name,"Simple config selection case",
               attribute,false);
    tcu::TestNode::addChild(node,(TestNode *)pCVar4);
    pCVar4 = (ChooseConfigSimpleCase *)operator_new(0xa8);
    ChooseConfigSimpleCase::ChooseConfigSimpleCase
              (pCVar4,(this->super_TestCaseGroup).m_eglTestCtx,name,
               "Simple config selection and sort case",attribute,true);
    tcu::TestNode::addChild(node_00,(TestNode *)pCVar4);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Random eglChooseConfig() usage");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pCVar5 = (ChooseConfigRandomCase *)operator_new(0xd8);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &set._M_t._M_impl.super__Rb_tree_header._M_header;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 4) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&set,(uint *)((long)init::rgbaSizes + lVar7));
  }
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar5,pEVar1,"color_sizes","Random color size rules",&set);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar5);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&set);
  pCVar5 = (ChooseConfigRandomCase *)operator_new(0xd8);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &set._M_t._M_impl.super__Rb_tree_header._M_header;
  set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 4) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&set,(uint *)((long)init::colorDepthStencilSizes + lVar7));
  }
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar5,pEVar1,"color_depth_stencil_sizes","Random color, depth and stencil size rules",
             &set);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar5);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&set);
  pCVar5 = (ChooseConfigRandomCase *)operator_new(0xd8);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &set._M_t._M_impl.super__Rb_tree_header._M_header;
  set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar7 = 0; lVar7 != 0x14; lVar7 = lVar7 + 4) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&set,(uint *)((long)init::bufferSizes + lVar7));
  }
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar5,pEVar1,"buffer_sizes","Various buffer size rules",&set);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar5);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&set._M_t);
  pCVar5 = (ChooseConfigRandomCase *)operator_new(0xd8);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  egl::(anonymous_namespace)::toSet<unsigned_int,2ul>
            (&set,(_anonymous_namespace_ *)init::surfaceType,arr);
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar5,pEVar1,"surface_type","Surface type rules",&set);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar5);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&set._M_t);
  pCVar5 = (ChooseConfigRandomCase *)operator_new(0xd8);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  egl::(anonymous_namespace)::toSet<unsigned_int,2ul>
            (&set,(_anonymous_namespace_ *)init::sampleBuffers,arr_00);
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar5,pEVar1,"sample_buffers","Sample buffer rules",&set);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar5);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&set);
  pCVar5 = (ChooseConfigRandomCase *)operator_new(0xd8);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &set._M_t._M_impl.super__Rb_tree_header._M_header;
  set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar7 = 0; lVar7 != 0x60; lVar7 = lVar7 + 4) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&set,(uint *)((long)init::allAttribs + lVar7));
  }
  ChooseConfigRandomCase::ChooseConfigRandomCase(pCVar5,pEVar1,"all","All attributes",&set);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar5);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&set._M_t);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "color_component_type_ext","EGL_EXT_pixel_format_float tests");
  set._M_t._M_impl._0_8_ = pTVar3;
  pCVar6 = (ColorComponentTypeCase *)operator_new(0xa8);
  ColorComponentTypeCase::ColorComponentTypeCase
            (pCVar6,(this->super_TestCaseGroup).m_eglTestCtx,"dont_care",0xffffffff);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar6);
  uVar2 = set._M_t._M_impl._0_8_;
  pCVar6 = (ColorComponentTypeCase *)operator_new(0xa8);
  ColorComponentTypeCase::ColorComponentTypeCase
            (pCVar6,(this->super_TestCaseGroup).m_eglTestCtx,"fixed",0x333a);
  tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pCVar6);
  uVar2 = set._M_t._M_impl._0_8_;
  pCVar6 = (ColorComponentTypeCase *)operator_new(0xa8);
  ColorComponentTypeCase::ColorComponentTypeCase
            (pCVar6,(this->super_TestCaseGroup).m_eglTestCtx,"float",0x333b);
  tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pCVar6);
  uVar2 = set._M_t._M_impl._0_8_;
  set._M_t._M_impl._0_8_ = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)uVar2);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&set);
  return extraout_EAX;
}

Assistant:

void ChooseConfigTests::init (void)
{
	// Single attributes
	{
		static const struct
		{
			EGLenum			attribute;
			const char*		testName;
		} attributes[] =
		{
			{ EGL_BUFFER_SIZE,				"buffer_size"				},
			{ EGL_RED_SIZE,					"red_size"					},
			{ EGL_GREEN_SIZE,				"green_size"				},
			{ EGL_BLUE_SIZE,				"blue_size"					},
			{ EGL_LUMINANCE_SIZE,			"luminance_size"			},
			{ EGL_ALPHA_SIZE,				"alpha_size"				},
			{ EGL_ALPHA_MASK_SIZE,			"alpha_mask_size"			},
			{ EGL_BIND_TO_TEXTURE_RGB,		"bind_to_texture_rgb"		},
			{ EGL_BIND_TO_TEXTURE_RGBA,		"bind_to_texture_rgba"		},
			{ EGL_COLOR_BUFFER_TYPE,		"color_buffer_type"			},
			{ EGL_CONFIG_CAVEAT,			"config_caveat"				},
			{ EGL_CONFIG_ID,				"config_id"					},
			{ EGL_CONFORMANT,				"conformant"				},
			{ EGL_DEPTH_SIZE,				"depth_size"				},
			{ EGL_LEVEL,					"level"						},
			{ EGL_MAX_SWAP_INTERVAL,		"max_swap_interval"			},
			{ EGL_MIN_SWAP_INTERVAL,		"min_swap_interval"			},
			{ EGL_NATIVE_RENDERABLE,		"native_renderable"			},
			{ EGL_NATIVE_VISUAL_TYPE,		"native_visual_type"		},
			{ EGL_RENDERABLE_TYPE,			"renderable_type"			},
			{ EGL_SAMPLE_BUFFERS,			"sample_buffers"			},
			{ EGL_SAMPLES,					"samples"					},
			{ EGL_STENCIL_SIZE,				"stencil_size"				},
			{ EGL_SURFACE_TYPE,				"surface_type"				},
			{ EGL_TRANSPARENT_TYPE,			"transparent_type"			},
			{ EGL_TRANSPARENT_RED_VALUE,	"transparent_red_value"		},
			{ EGL_TRANSPARENT_GREEN_VALUE,	"transparent_green_value"	},
			{ EGL_TRANSPARENT_BLUE_VALUE,	"transparent_blue_value"	}
		};

		tcu::TestCaseGroup* simpleGroup = new tcu::TestCaseGroup(m_testCtx, "simple", "Simple tests");
		addChild(simpleGroup);

		tcu::TestCaseGroup* selectionGroup = new tcu::TestCaseGroup(m_testCtx, "selection_only", "Selection tests, order ignored");
		simpleGroup->addChild(selectionGroup);

		tcu::TestCaseGroup* sortGroup = new tcu::TestCaseGroup(m_testCtx, "selection_and_sort", "Selection and ordering tests");
		simpleGroup->addChild(sortGroup);

		for (int ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(attributes); ndx++)
		{
			selectionGroup->addChild(new ChooseConfigSimpleCase(m_eglTestCtx, attributes[ndx].testName, "Simple config selection case", attributes[ndx].attribute, false));
			sortGroup->addChild(new ChooseConfigSimpleCase(m_eglTestCtx, attributes[ndx].testName, "Simple config selection and sort case", attributes[ndx].attribute, true));
		}
	}

	// Random
	{
		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random eglChooseConfig() usage");
		addChild(randomGroup);

		static const EGLenum rgbaSizes[] =
		{
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_ALPHA_SIZE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "color_sizes", "Random color size rules", toSet(rgbaSizes)));

		static const EGLenum colorDepthStencilSizes[] =
		{
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_ALPHA_SIZE,
			EGL_DEPTH_SIZE,
			EGL_STENCIL_SIZE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "color_depth_stencil_sizes", "Random color, depth and stencil size rules", toSet(colorDepthStencilSizes)));

		static const EGLenum bufferSizes[] =
		{
			EGL_BUFFER_SIZE,
			EGL_LUMINANCE_SIZE,
			EGL_ALPHA_MASK_SIZE,
			EGL_DEPTH_SIZE,
			EGL_STENCIL_SIZE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "buffer_sizes", "Various buffer size rules", toSet(bufferSizes)));

		static const EGLenum surfaceType[] =
		{
			EGL_NATIVE_RENDERABLE,
			EGL_SURFACE_TYPE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "surface_type", "Surface type rules", toSet(surfaceType)));

		static const EGLenum sampleBuffers[] =
		{
			EGL_SAMPLE_BUFFERS,
			EGL_SAMPLES
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "sample_buffers", "Sample buffer rules", toSet(sampleBuffers)));

		// \note Not every attribute is supported at the moment
		static const EGLenum allAttribs[] =
		{
			EGL_BUFFER_SIZE,
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_ALPHA_SIZE,
			EGL_ALPHA_MASK_SIZE,
			EGL_BIND_TO_TEXTURE_RGB,
			EGL_BIND_TO_TEXTURE_RGBA,
			EGL_COLOR_BUFFER_TYPE,
			EGL_CONFIG_CAVEAT,
			EGL_CONFIG_ID,
			EGL_CONFORMANT,
			EGL_DEPTH_SIZE,
			EGL_LEVEL,
//			EGL_MATCH_NATIVE_PIXMAP,
			EGL_MAX_SWAP_INTERVAL,
			EGL_MIN_SWAP_INTERVAL,
			EGL_NATIVE_RENDERABLE,
			EGL_NATIVE_VISUAL_TYPE,
			EGL_RENDERABLE_TYPE,
			EGL_SAMPLE_BUFFERS,
			EGL_SAMPLES,
			EGL_STENCIL_SIZE,
			EGL_SURFACE_TYPE,
			EGL_TRANSPARENT_TYPE,
//			EGL_TRANSPARENT_RED_VALUE,
//			EGL_TRANSPARENT_GREEN_VALUE,
//			EGL_TRANSPARENT_BLUE_VALUE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "all", "All attributes", toSet(allAttribs)));
	}

	// EGL_EXT_pixel_format_float
	{
		de::MovePtr<tcu::TestCaseGroup>	colorComponentTypeGroup	(new tcu::TestCaseGroup(m_testCtx, "color_component_type_ext", "EGL_EXT_pixel_format_float tests"));

		colorComponentTypeGroup->addChild(new ColorComponentTypeCase(m_eglTestCtx, "dont_care",	EGL_DONT_CARE));
		colorComponentTypeGroup->addChild(new ColorComponentTypeCase(m_eglTestCtx, "fixed",		EGL_COLOR_COMPONENT_TYPE_FIXED_EXT));
		colorComponentTypeGroup->addChild(new ColorComponentTypeCase(m_eglTestCtx, "float",		EGL_COLOR_COMPONENT_TYPE_FLOAT_EXT));

		addChild(colorComponentTypeGroup.release());
	}
}